

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server.cxx
# Opt level: O2

string * __thiscall
nuraft::raft_server::get_user_ctx_abi_cxx11_(string *__return_storage_ptr__,raft_server *this)

{
  ptr<cluster_config> c_conf;
  _func_int **local_20;
  
  get_config((raft_server *)&stack0xffffffffffffffe0);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)(local_20 + 3));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffffe8);
  return __return_storage_ptr__;
}

Assistant:

std::string raft_server::get_user_ctx() const {
    ptr<cluster_config> c_conf = get_config();
    return c_conf->get_user_ctx();
}